

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase_test.cpp
# Opt level: O0

void __thiscall
jhu::thrax::PhraseTests_LoosePhrases_Test::TestBody(PhraseTests_LoosePhrases_Test *this)

{
  bool bVar1;
  char *message;
  char *in_RCX;
  string_view line;
  AssertHelper local_c0;
  Message local_b8;
  size_type local_b0;
  int local_a4;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar;
  undefined1 local_80 [8];
  vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_> ps;
  size_t local_60;
  undefined1 local_58 [8];
  AlignedSentencePair asp;
  PhraseTests_LoosePhrases_Test *this_local;
  
  asp.alignment.super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             &ps.super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,"a b c\td e f\t1-1");
  line._M_str = in_RCX;
  line._M_len = local_60;
  readAlignedSentencePair<false,false>
            ((AlignedSentencePair *)local_58,
             (thrax *)ps.
                      super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,line);
  allConsistentPairs((vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_> *)local_80
                     ,(AlignedSentencePair *)local_58,10);
  local_a4 = 0x10;
  local_b0 = std::vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>::size
                       ((vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_> *)
                        local_80);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_a0,"16","ps.size()",&local_a4,&local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/phrase_test.cpp"
               ,0x78,message);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  std::vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>::~vector
            ((vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_> *)local_80);
  AlignedSentencePair::~AlignedSentencePair((AlignedSentencePair *)local_58);
  return;
}

Assistant:

TEST(PhraseTests, LoosePhrases) {
  auto asp = readAlignedSentencePair<false, false>("a b c\td e f\t1-1");
  auto ps = allConsistentPairs(asp, 10);
  ASSERT_EQ(16, ps.size());
}